

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

void __thiscall
t_rb_generator::generate_process_function
          (t_rb_generator *this,t_service *tservice,t_function *tfunction)

{
  t_rb_ofstream *ptVar1;
  undefined1 *puVar2;
  pointer pcVar3;
  t_struct *ptVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool bVar6;
  byte bVar7;
  ostream *poVar8;
  long *plVar9;
  long *plVar10;
  int iVar11;
  pointer pptVar12;
  string resultname;
  string argsname;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  t_struct *local_b8;
  string local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  long lStack_38;
  
  ptVar1 = &this->f_service_;
  if (0 < *(int *)&(this->f_service_).super_ofstream.
                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
    iVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
      iVar11 = iVar11 + 1;
    } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                               super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"def process_",0xc);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)ptVar1,(tfunction->name_)._M_dataplus._M_p,
                      (tfunction->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(seqid, iprot, oprot)",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  puVar2 = &(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            field_0xf8;
  *(int *)puVar2 = *(int *)puVar2 + 1;
  pcVar3 = (tfunction->name_)._M_dataplus._M_p;
  local_50 = (long *)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (tfunction->name_)._M_string_length);
  plVar9 = local_50;
  iVar11 = toupper((int)(char)*local_50);
  *(char *)plVar9 = (char)iVar11;
  local_d8 = &local_c8;
  if (local_50 == (long *)local_40) {
    lStack_c0 = lStack_38;
  }
  else {
    local_d8 = local_50;
  }
  local_d0 = local_48;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = (long *)local_40;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_70 = &local_60;
  plVar10 = plVar9 + 2;
  if ((long *)*plVar9 == plVar10) {
    local_60 = *plVar10;
    lStack_58 = plVar9[3];
  }
  else {
    local_60 = *plVar10;
    local_70 = (long *)*plVar9;
  }
  local_68 = plVar9[1];
  *plVar9 = (long)plVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_50 != (long *)local_40) {
    operator_delete(local_50);
  }
  pcVar3 = (tfunction->name_)._M_dataplus._M_p;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + (tfunction->name_)._M_string_length);
  paVar5 = local_90;
  iVar11 = toupper((int)local_90->_M_local_buf[0]);
  paVar5->_M_local_buf[0] = (char)iVar11;
  if (local_90 == &local_80) {
    local_b0.field_2._8_8_ = local_80._8_8_;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)local_90;
  }
  local_b0._M_string_length = local_88;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_90 = &local_80;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_d8 = &local_c8;
  plVar10 = plVar9 + 2;
  if ((long *)*plVar9 == plVar10) {
    local_c8 = *plVar10;
    lStack_c0 = plVar9[3];
  }
  else {
    local_c8 = *plVar10;
    local_d8 = (long *)*plVar9;
  }
  local_d0 = plVar9[1];
  *plVar9 = (long)plVar10;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (0 < *(int *)&(this->f_service_).super_ofstream.
                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
    iVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
      iVar11 = iVar11 + 1;
    } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                               super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ptVar1,"args = read_args(iprot, ",0x18);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)ptVar1,(char *)local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  local_b8 = tfunction->xceptions_;
  if (tfunction->oneway_ == false) {
    if (0 < *(int *)&(this->f_service_).super_ofstream.
                     super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
      iVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"result = ",9);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)ptVar1,(char *)local_d8,local_d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".new()",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  iVar11 = *(int *)&(this->f_service_).super_ofstream.
                    super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  if ((local_b8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_b8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    if (0 < iVar11) {
      iVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"begin",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ptVar1,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    iVar11 = *(int *)&(this->f_service_).super_ofstream.
                      super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 + 1;
    *(int *)&(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
             field_0xf8 = iVar11;
  }
  ptVar4 = tfunction->arglist_;
  if (0 < iVar11) {
    iVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
      iVar11 = iVar11 + 1;
    } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                               super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
  }
  if ((tfunction->oneway_ == false) &&
     (iVar11 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])(), (char)iVar11 == '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"result.success = ",0x11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"@handler.",9);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)ptVar1,(tfunction->name_)._M_dataplus._M_p,
                      (tfunction->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
  pptVar12 = (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar12 !=
      (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar6 = true;
    do {
      if (!bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"args.",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ptVar1,((*pptVar12)->name_)._M_dataplus._M_p,
                 ((*pptVar12)->name_)._M_string_length);
      pptVar12 = pptVar12 + 1;
      bVar6 = false;
    } while (pptVar12 !=
             (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ptVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  bVar7 = tfunction->oneway_;
  if (((bool)bVar7 == false) &&
     (pptVar12 = (local_b8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
     (local_b8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
     super__Vector_impl_data._M_finish != pptVar12)) {
    iVar11 = *(int *)&(this->f_service_).super_ofstream.
                      super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 + -1;
    *(int *)&(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
             field_0xf8 = iVar11;
    do {
      if (0 < iVar11) {
        iVar11 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
          iVar11 = iVar11 + 1;
        } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                                   super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"rescue ",7);
      full_type_name_abi_cxx11_(&local_b0,this,(*pptVar12)->type_);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)ptVar1,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," => ",4);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,((*pptVar12)->name_)._M_dataplus._M_p,
                          ((*pptVar12)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (tfunction->oneway_ == false) {
        iVar11 = *(int *)&(this->f_service_).super_ofstream.
                          super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
        *(int *)&(this->f_service_).super_ofstream.
                 super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8 = iVar11 + 1;
        if (-1 < iVar11) {
          iVar11 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
            iVar11 = iVar11 + 1;
          } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                                     super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"result.",7);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)ptVar1,((*pptVar12)->name_)._M_dataplus._M_p,
                            ((*pptVar12)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,((*pptVar12)->name_)._M_dataplus._M_p,
                            ((*pptVar12)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        puVar2 = &(this->f_service_).super_ofstream.
                  super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
        *(int *)puVar2 = *(int *)puVar2 + -1;
      }
      pptVar12 = pptVar12 + 1;
      iVar11 = *(int *)&(this->f_service_).super_ofstream.
                        super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
    } while (pptVar12 !=
             (local_b8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (0 < iVar11) {
      iVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"end",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ptVar1,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    bVar7 = tfunction->oneway_;
  }
  iVar11 = *(int *)&(this->f_service_).super_ofstream.
                    super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  if ((bVar7 & 1) == 0) {
    if (0 < iVar11) {
      iVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ptVar1,"write_result(result, oprot, \'",0x1d);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)ptVar1,(tfunction->name_)._M_dataplus._M_p,
                        (tfunction->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\', seqid)",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    iVar11 = *(int *)&(this->f_service_).super_ofstream.
                      super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
    *(int *)&(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
             field_0xf8 = iVar11 + -1;
    if (1 < iVar11) {
      iVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    }
  }
  else {
    if (0 < iVar11) {
      iVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"return",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ptVar1,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
    iVar11 = *(int *)&(this->f_service_).super_ofstream.
                      super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
    *(int *)&(this->f_service_).super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
             field_0xf8 = iVar11 + -1;
    if (1 < iVar11) {
      iVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"  ",2);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)&(this->f_service_).super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)ptVar1,"end",3);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)ptVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void t_rb_generator::generate_process_function(t_service* tservice, t_function* tfunction) {
  (void)tservice;
  // Open function
  f_service_.indent() << "def process_" << tfunction->get_name() << "(seqid, iprot, oprot)" << endl;
  f_service_.indent_up();

  string argsname = capitalize(tfunction->get_name()) + "_args";
  string resultname = capitalize(tfunction->get_name()) + "_result";

  f_service_.indent() << "args = read_args(iprot, " << argsname << ")" << endl;

  t_struct* xs = tfunction->get_xceptions();
  const std::vector<t_field*>& xceptions = xs->get_members();
  vector<t_field*>::const_iterator x_iter;

  // Declare result for non oneway function
  if (!tfunction->is_oneway()) {
    f_service_.indent() << "result = " << resultname << ".new()" << endl;
  }

  // Try block for a function with exceptions
  if (xceptions.size() > 0) {
    f_service_.indent() << "begin" << endl;
    f_service_.indent_up();
  }

  // Generate the function call
  t_struct* arg_struct = tfunction->get_arglist();
  const std::vector<t_field*>& fields = arg_struct->get_members();
  vector<t_field*>::const_iterator f_iter;

  f_service_.indent();
  if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void()) {
    f_service_ << "result.success = ";
  }
  f_service_ << "@handler." << tfunction->get_name() << "(";
  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
    } else {
      f_service_ << ", ";
    }
    f_service_ << "args." << (*f_iter)->get_name();
  }
  f_service_ << ")" << endl;

  if (!tfunction->is_oneway() && xceptions.size() > 0) {
    f_service_.indent_down();
    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      f_service_.indent() << "rescue " << full_type_name((*x_iter)->get_type()) << " => "
                          << (*x_iter)->get_name() << endl;
      if (!tfunction->is_oneway()) {
        f_service_.indent_up();
        f_service_.indent() << "result." << (*x_iter)->get_name() << " = " << (*x_iter)->get_name()
                            << endl;
        f_service_.indent_down();
      }
    }
    f_service_.indent() << "end" << endl;
  }

  // Shortcut out here for oneway functions
  if (tfunction->is_oneway()) {
    f_service_.indent() << "return" << endl;
    f_service_.indent_down();
    f_service_.indent() << "end" << endl << endl;
    return;
  }

  f_service_.indent() << "write_result(result, oprot, '" << tfunction->get_name() << "', seqid)"
                      << endl;

  // Close function
  f_service_.indent_down();
  f_service_.indent() << "end" << endl << endl;
}